

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readTiledRgba1.cpp
# Opt level: O0

void readTiledRgba1(char *fileName,Array2D<Imf_3_4::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  Rgba *pRVar3;
  int *in_RCX;
  int *in_RDX;
  Array2D<Imf_3_4::Rgba> *in_RSI;
  char *in_RDI;
  int dy;
  int dx;
  Box2i dw;
  TiledRgbaInputFile in;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_68;
  int local_64;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Rgba in_stack_ffffffffffffffa8;
  Array2D<Imf_3_4::Rgba> *in_stack_ffffffffffffffb0;
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
            ((TiledRgbaInputFile *)&stack0xffffffffffffffa8,in_RDI,iVar1);
  Imf_3_4::TiledRgbaInputFile::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  *in_RDX = (in_stack_ffffffffffffffa0 - local_68) + 1;
  *in_RCX = (in_stack_ffffffffffffffa4 - local_64) + 1;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase
            (in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pRVar3 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](in_RSI,(long)-local_64);
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer
            ((Rgba *)&stack0xffffffffffffffa8,(ulong)(pRVar3 + -local_68),1);
  iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&stack0xffffffffffffffa8);
  iVar1 = iVar1 + -1;
  iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&stack0xffffffffffffffa8);
  Imf_3_4::TiledRgbaInputFile::readTiles((int)&stack0xffffffffffffffa8,0,iVar1,0,iVar2 + -1);
  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

void
readTiledRgba1 (
    const char fileName[], Array2D<Rgba>& pixels, int& width, int& height)
{
    TiledRgbaInputFile in (fileName);

    Box2i dw = in.dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;

    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    in.setFrameBuffer (&pixels[-dy][-dx], 1, width);
    in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
}